

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcsncpy(char16_t *strDest,char16_t *strSource,size_t count)

{
  size_t sVar1;
  ulong local_38;
  UINT length;
  size_t count_local;
  char16_t *strSource_local;
  char16_t *strDest_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  memset(strDest,0,(count & 0x7fffffff) << 1);
  sVar1 = PAL_wcslen(strSource);
  local_38 = count;
  if (sVar1 <= count) {
    local_38 = PAL_wcslen(strSource);
  }
  memcpy(strDest,strSource,(local_38 & 0x7fffffff) << 1);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return strDest;
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcsncpy( char16_t * strDest, const char16_t *strSource, size_t count )
{
    UINT length = sizeof( char16_t ) * count;
    PERF_ENTRY(wcsncpy);
    ENTRY("wcsncpy( strDest:%p, strSource:%p (%S), count:%lu)\n",
          strDest, strSource, strSource, (unsigned long) count);

    memset( strDest, 0, length );
    length = min( count, PAL_wcslen( strSource ) ) * sizeof( char16_t );
    memcpy( strDest, strSource, length );

    LOGEXIT("wcsncpy returning (char16_t*): %p\n", strDest);
    PERF_EXIT(wcsncpy);
    return strDest;
}